

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

void __thiscall leveldb::VersionSet::Builder::~Builder(Builder *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  _Rb_tree<leveldb::FileMetaData_*,_leveldb::FileMetaData_*,_std::_Identity<leveldb::FileMetaData_*>,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
  *this_00;
  FileMetaData *pFVar3;
  pointer pcVar4;
  bool bVar5;
  _Base_ptr p_Var6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> to_unref;
  FileMetaData **local_58;
  FileMetaData **ppFStack_50;
  FileMetaData **local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar8 = 0;
  do {
    this_00 = &(this->levels_[lVar8].added_files)->_M_t;
    local_58 = (FileMetaData **)0x0;
    ppFStack_50 = (FileMetaData **)0x0;
    local_48 = (FileMetaData **)0x0;
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::reserve
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               &local_58,(this_00->_M_impl).super__Rb_tree_header._M_node_count);
    for (p_Var6 = (this_00->_M_impl).super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(this_00->_M_impl).super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      if (ppFStack_50 == local_48) {
        std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
        _M_realloc_insert<leveldb::FileMetaData*const&>
                  ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)
                   &local_58,(iterator)ppFStack_50,(FileMetaData **)(p_Var6 + 1));
      }
      else {
        *ppFStack_50 = *(FileMetaData **)(p_Var6 + 1);
        ppFStack_50 = ppFStack_50 + 1;
      }
    }
    std::
    _Rb_tree<leveldb::FileMetaData_*,_leveldb::FileMetaData_*,_std::_Identity<leveldb::FileMetaData_*>,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
    ::~_Rb_tree(this_00);
    operator_delete(this_00,0x30);
    if (ppFStack_50 != local_58) {
      uVar7 = 0;
      uVar9 = 1;
      do {
        pFVar3 = local_58[uVar7];
        iVar2 = pFVar3->refs;
        pFVar3->refs = iVar2 + -1;
        if (iVar2 < 2) {
          pcVar4 = (pFVar3->largest).rep_._M_dataplus._M_p;
          paVar1 = &(pFVar3->largest).rep_.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 != paVar1) {
            operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
          }
          pcVar4 = (pFVar3->smallest).rep_._M_dataplus._M_p;
          paVar1 = &(pFVar3->smallest).rep_.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 != paVar1) {
            operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
          }
          operator_delete(pFVar3,0x58);
        }
        bVar5 = uVar9 < (ulong)((long)ppFStack_50 - (long)local_58 >> 3);
        uVar7 = uVar9;
        uVar9 = (ulong)((int)uVar9 + 1);
      } while (bVar5);
    }
    if (local_58 != (FileMetaData **)0x0) {
      operator_delete(local_58,(long)local_48 - (long)local_58);
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 7);
  Version::Unref(this->base_);
  lVar8 = 0x160;
  do {
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)((long)this->levels_ + lVar8 + -0x10));
    lVar8 = lVar8 + -0x38;
  } while (lVar8 != -0x28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

~Builder() {
    for (int level = 0; level < config::kNumLevels; level++) {
      const FileSet* added = levels_[level].added_files;
      std::vector<FileMetaData*> to_unref;
      to_unref.reserve(added->size());
      for (FileSet::const_iterator it = added->begin(); it != added->end();
           ++it) {
        to_unref.push_back(*it);
      }
      delete added;
      for (uint32_t i = 0; i < to_unref.size(); i++) {
        FileMetaData* f = to_unref[i];
        f->refs--;
        if (f->refs <= 0) {
          delete f;
        }
      }
    }
    base_->Unref();
  }